

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

cmList * __thiscall
cmList::transform(cmList *this,TransformAction action,string *arg1,string *arg2,
                 unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                 *selector)

{
  TransformSelector *pTVar1;
  iterator descriptor;
  _Base_ptr *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  _Base_ptr local_30;
  
  local_30 = (_Base_ptr)anon_unknown.dwarf_c989e::TransformConfigure(action,selector,2);
  (**(code **)(*(long *)local_30[2]._M_left + 0x18))
            (local_30[2]._M_left,
             (selector->_M_t).
             super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
             .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl,arg1,arg2);
  pTVar1 = (selector->_M_t).
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  local_48 = 0;
  local_38 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:782:19)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:782:19)>
             ::_M_manager;
  local_50 = &local_30;
  (*pTVar1->_vptr_TransformSelector[5])(pTVar1,this);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return this;
}

Assistant:

cmList& cmList::transform(TransformAction action, std::string const& arg1,
                          std::string const& arg2,
                          std::unique_ptr<TransformSelector> selector)
{
  auto descriptor = TransformConfigure(action, selector, 2);

  descriptor->Transform->Initialize(
    static_cast<::TransformSelector*>(selector.get()), arg1, arg2);

  static_cast<::TransformSelector&>(*selector).Transform(
    this->Values, [&descriptor](const std::string& s) -> std::string {
      return (*descriptor->Transform)(s);
    });

  return *this;
}